

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_init(archive_read_filter *self)

{
  lzma_stream *strm;
  byte bVar1;
  lzma_ret lVar2;
  void *pvVar3;
  int ret;
  int log2dic;
  uint32_t dicsize;
  ssize_t avail_in;
  undefined1 auStack_48 [3];
  uchar props [5];
  lzma_filter filters [2];
  uchar *h;
  private_data_conflict2 *state;
  archive_read_filter *self_local;
  
  strm = (lzma_stream *)self->data;
  pvVar3 = __archive_read_filter_ahead(self->upstream,6,(ssize_t *)&log2dic);
  if (pvVar3 == (void *)0x0) {
    self_local._4_4_ = -0x1e;
  }
  else {
    *(undefined1 *)((long)&strm[1].next_out + 2) = *(undefined1 *)((long)pvVar3 + 4);
    avail_in._3_1_ = 0x5d;
    bVar1 = *(byte *)((long)pvVar3 + 5) & 0x1f;
    if ((bVar1 < 0xc) || (0x1b < bVar1)) {
      self_local._4_4_ = -0x1e;
    }
    else {
      ret = 1 << bVar1;
      if (0xc < bVar1) {
        ret = ret - ((uint)ret >> 4) * ((int)(uint)*(byte *)((long)pvVar3 + 5) >> 5);
      }
      archive_le32enc((void *)((long)&avail_in + 4),ret);
      __archive_read_filter_consume(self->upstream,6);
      strm[1].avail_out = 6;
      _auStack_48 = 0x4000000000000001;
      lVar2 = lzma_properties_decode
                        ((lzma_filter *)auStack_48,(lzma_allocator *)0x0,
                         (uint8_t *)((long)&avail_in + 3),5);
      if (lVar2 == LZMA_OK) {
        lVar2 = lzma_raw_decoder(strm,(lzma_filter *)auStack_48);
        free((void *)0x0);
        if (lVar2 == LZMA_OK) {
          self_local._4_4_ = 0;
        }
        else {
          set_error(self,lVar2);
          self_local._4_4_ = -0x1e;
        }
      }
      else {
        set_error(self,lVar2);
        self_local._4_4_ = -0x1e;
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
lzip_init(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *h;
	lzma_filter filters[2];
	unsigned char props[5];
	ssize_t avail_in;
	uint32_t dicsize;
	int log2dic, ret;

	state = (struct private_data *)self->data;
	h = __archive_read_filter_ahead(self->upstream, 6, &avail_in);
	if (h == NULL)
		return (ARCHIVE_FATAL);

	/* Get a version number. */
	state->lzip_ver = h[4];

	/*
	 * Setup lzma property.
	 */
	props[0] = 0x5d;

	/* Get dictionary size. */
	log2dic = h[5] & 0x1f;
	if (log2dic < 12 || log2dic > 27)
		return (ARCHIVE_FATAL);
	dicsize = 1U << log2dic;
	if (log2dic > 12)
		dicsize -= (dicsize / 16) * (h[5] >> 5);
	archive_le32enc(props+1, dicsize);

	/* Consume lzip header. */
	__archive_read_filter_consume(self->upstream, 6);
	state->member_in = 6;

	filters[0].id = LZMA_FILTER_LZMA1;
	filters[0].options = NULL;
	filters[1].id = LZMA_VLI_UNKNOWN;
	filters[1].options = NULL;

	ret = lzma_properties_decode(&filters[0], NULL, props, sizeof(props));
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	ret = lzma_raw_decoder(&(state->stream), filters);
	free(filters[0].options);
	if (ret != LZMA_OK) {
		set_error(self, ret);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}